

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-extra-test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2992::OutputRedirectTest_ErrorInDtor_Test::TestBody
          (OutputRedirectTest_ErrorInDtor_Test *this)

{
  bool bVar1;
  OutputRedirect *p;
  FILE *__stream;
  AssertionResult *pAVar2;
  int __fd2;
  string gtest_output;
  OutputRedirect gtest_redir;
  string gtest_expected_output;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  scoped_ptr<OutputRedirect> redir;
  buffered_file f;
  file write_copy;
  int write_fd;
  string_view in_stack_00000120;
  file write_end;
  file read_end;
  OutputRedirect *in_stack_00000ef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  OutputRedirect *in_stack_fffffffffffffec8;
  OutputRedirect *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  int line;
  AssertionResult *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  Type in_stack_fffffffffffffeec;
  OutputRedirect *in_stack_fffffffffffffef0;
  string local_d0 [8];
  Message *in_stack_ffffffffffffff38;
  AssertHelper *in_stack_ffffffffffffff40;
  string local_90 [32];
  AssertionResult local_70 [2];
  int local_50;
  undefined1 local_49;
  AssertionResult local_48;
  scoped_ptr<OutputRedirect> local_38;
  buffered_file local_30;
  file local_24;
  int local_20;
  file local_10;
  file local_c [3];
  
  fmt::v5::file::file(local_c);
  fmt::v5::file::file(&local_10);
  fmt::v5::file::pipe(local_c,&local_10.fd_);
  local_20 = fmt::v5::file::descriptor(&local_10);
  fmt::v5::file::dup(&local_24,local_20);
  fmt::v5::file::fdopen((file *)&local_30,(int)&local_10,"w");
  p = (OutputRedirect *)operator_new(0x10);
  fmt::v5::buffered_file::get(&local_30);
  OutputRedirect::OutputRedirect
            (in_stack_fffffffffffffef0,
             (FILE *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  testing::internal::scoped_ptr<OutputRedirect>::scoped_ptr(&local_38,p);
  local_49 = 0x78;
  __stream = (FILE *)fmt::v5::buffered_file::get(&local_30);
  local_50 = fputc(0x78,__stream);
  testing::internal::EqHelper<false>::Compare<char,int>
            (in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
             (char *)in_stack_fffffffffffffec8,(int *)in_stack_fffffffffffffec0);
  line = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_48);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffef0);
    in_stack_fffffffffffffef0 =
         (OutputRedirect *)testing::AssertionResult::failure_message((AssertionResult *)0x1218fb);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
               &in_stack_fffffffffffffee0->success_,line,(char *)in_stack_fffffffffffffed0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffec0);
    testing::Message::~Message((Message *)0x121958);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1219c9);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_70);
  if (bVar1) {
    fmt::v5::basic_string_view<char>::basic_string_view
              ((basic_string_view<char> *)in_stack_fffffffffffffec0,
               (char *)in_stack_fffffffffffffeb8);
    format_system_error_abi_cxx11_(f.file_._4_4_,in_stack_00000120);
    OutputRedirect::OutputRedirect
              (in_stack_fffffffffffffef0,
               (FILE *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    bVar1 = testing::internal::AlwaysTrue();
    in_stack_fffffffffffffeec = CONCAT13(bVar1,(int3)in_stack_fffffffffffffeec);
    if (bVar1) {
      close(local_20);
      testing::internal::scoped_ptr<OutputRedirect>::reset
                ((scoped_ptr<OutputRedirect> *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    }
    OutputRedirect::restore_and_read_abi_cxx11_(in_stack_00000ef8);
    bVar1 = std::operator!=(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    if (bVar1) {
      in_stack_fffffffffffffee0 =
           testing::AssertionResult::operator<<
                     ((AssertionResult *)in_stack_fffffffffffffef0,
                      (char (*) [71])CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      pAVar2 = testing::AssertionResult::operator<<
                         ((AssertionResult *)in_stack_fffffffffffffef0,
                          (char (*) [11])
                          CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      line = (int)((ulong)pAVar2 >> 0x20);
      in_stack_fffffffffffffed0 =
           (OutputRedirect *)
           testing::AssertionResult::operator<<
                     ((AssertionResult *)in_stack_fffffffffffffef0,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      testing::AssertionResult::operator<<
                ((AssertionResult *)in_stack_fffffffffffffef0,
                 (char (*) [2])CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      in_stack_fffffffffffffec0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           testing::AssertionResult::operator<<
                     ((AssertionResult *)in_stack_fffffffffffffef0,
                      (char (*) [11])CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      testing::AssertionResult::operator<<
                ((AssertionResult *)in_stack_fffffffffffffef0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    }
    std::__cxx11::string::~string(local_d0);
    OutputRedirect::~OutputRedirect(in_stack_fffffffffffffed0);
    std::__cxx11::string::~string(local_90);
    if (!bVar1) goto LAB_00121cc4;
  }
  testing::Message::Message((Message *)in_stack_fffffffffffffef0);
  testing::AssertionResult::failure_message((AssertionResult *)0x121c36);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
             &in_stack_fffffffffffffee0->success_,line,(char *)in_stack_fffffffffffffed0);
  testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffec0);
  testing::Message::~Message((Message *)0x121c82);
LAB_00121cc4:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x121cd1);
  fmt::v5::file::dup2(&local_24,local_20,__fd2);
  testing::internal::scoped_ptr<OutputRedirect>::~scoped_ptr((scoped_ptr<OutputRedirect> *)0x121cf4)
  ;
  fmt::v5::buffered_file::~buffered_file((buffered_file *)in_stack_fffffffffffffed0);
  fmt::v5::file::~file((file *)in_stack_fffffffffffffed0);
  fmt::v5::file::~file((file *)in_stack_fffffffffffffed0);
  fmt::v5::file::~file((file *)in_stack_fffffffffffffed0);
  return;
}

Assistant:

TEST(OutputRedirectTest, ErrorInDtor) {
  file read_end, write_end;
  file::pipe(read_end, write_end);
  int write_fd = write_end.descriptor();
  file write_copy = write_end.dup(write_fd);
  buffered_file f = write_end.fdopen("w");
  scoped_ptr<OutputRedirect> redir(new OutputRedirect(f.get()));
  // Put a character in a file buffer.
  EXPECT_EQ('x', fputc('x', f.get()));
  EXPECT_WRITE(stderr, {
      // The close function must be called inside EXPECT_WRITE, otherwise
      // the system may recycle closed file descriptor when redirecting the
      // output in EXPECT_STDERR and the second close will break output
      // redirection.
      FMT_POSIX(close(write_fd));
      SUPPRESS_ASSERT(redir.reset(FMT_NULL));
  }, format_system_error(EBADF, "cannot flush stream"));
  write_copy.dup2(write_fd); // "undo" close or dtor of buffered_file will fail
}